

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-kalman-filter.cpp
# Opt level: O3

double testKalmanFilter(void)

{
  double **ppdVar1;
  double *pdVar2;
  Index *pIVar3;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
  *pCVar4;
  double *pdVar5;
  double dVar6;
  Scalar SVar7;
  undefined8 uVar8;
  RhsNested pMVar9;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
  *pCVar10;
  CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *pCVar11;
  Matrix<double,_4,_4,_0,_4,_4> *pMVar12;
  undefined8 *puVar13;
  ulong uVar14;
  Index index;
  RhsNested pMVar15;
  LhsNested pMVar16;
  char *pcVar17;
  long lVar18;
  uint uVar19;
  Matrix<double,__1,_1,_0,__1,_1> *pMVar20;
  Index size;
  long lVar21;
  Index size_1;
  undefined4 uVar22;
  undefined4 uVar23;
  MeasureVector w;
  Pmatrix p;
  StateVector x;
  type tmp;
  StateVector xh;
  StateVector error;
  Dmatrix d;
  Cmatrix c;
  Bmatrix b;
  Qmatrix q1;
  Rmatrix r1;
  Qmatrix q;
  Rmatrix r;
  filter f;
  Matrix<double,_4,_4,_0,_4,_4> a;
  StateVector xk [1001];
  InputVector uk [1001];
  lagged_fibonacci1279 gen_;
  MeasureVector yk [1000];
  long local_e890;
  undefined1 local_e888 [24];
  undefined1 local_e870 [32];
  RhsNested local_e850;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
  local_e848;
  undefined1 *local_e800;
  double local_e7f8;
  plainobjectbase_evaluator_data<double,_0> local_e7f0;
  long local_e7e8;
  Matrix<double,__1,__1,_0,__1,__1> local_e7e0;
  void *local_e7c8;
  LhsNested local_e7c0;
  RhsNested local_e7b8;
  RhsNested local_e7b0;
  long local_e7a8;
  LhsNested local_e7a0;
  undefined1 local_e798 [24];
  undefined1 local_e780 [48];
  RhsNested local_e750 [3];
  void *local_e738 [3];
  RhsNested local_e720 [30];
  undefined8 local_e630;
  void *local_e488;
  undefined8 uStack_e480;
  undefined8 local_e478;
  void *pvStack_e470;
  undefined8 local_e468;
  undefined8 uStack_e460;
  Matrix<double,_4,_4,_0,_4,_4> local_e458;
  CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> local_e3d8 [500];
  Matrix<double,__1,_1,_0,__1,_1> local_a558;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
  *local_a548;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
  *pCStack_a540;
  undefined1 local_a538 [16000];
  lagged_fibonacci_01_engine<double,_48,_1279U,_418U> local_66b8;
  Matrix<double,__1,_1,_0,__1,_1> local_3eb8 [1000];
  
  stateObservation::KalmanFilterBase::KalmanFilterBase((KalmanFilterBase *)local_e720,4,3,2);
  local_e780._24_8_ = stateObservation::KalmanFilterBase::setR;
  local_e720[0] = (RhsNested)stateObservation::KalmanFilterBase::setR;
  local_e780._32_8_ = 0x11f2e0;
  local_e630 = 0x11f2e0;
  local_e488 = (void *)0x0;
  uStack_e480 = 0;
  local_e478 = 0;
  pvStack_e470 = (void *)0x0;
  local_e468 = 0;
  uStack_e460 = 0;
  local_e3d8[0].m_xpr = &local_e458;
  local_e3d8[0].m_row = 0;
  local_e3d8[0].m_col = 1;
  local_e3d8[0].m_currentBlockRows = 1;
  local_e458.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
       = -0.6785714;
  local_a548 = (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)0x3fbd9afef4674589;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                      (local_e3d8,(Scalar *)&local_a548);
  local_3eb8[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x3fdc1cb3298d9804;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                      (pCVar11,(Scalar *)local_3eb8);
  local_66b8._0_8_ =
       (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
        *)0x3fd2544a04301069;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                      (pCVar11,(Scalar *)&local_66b8);
  local_e848._0_8_ = (LhsNested)0x3fb626de911a6f17;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                      (pCVar11,(Scalar *)&local_e848);
  local_e7b0 = (RhsNested)0xbf9c09c3ce2089e3;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                      (pCVar11,(Scalar *)&local_e7b0);
  local_e7c8 = (void *)0x3fd578ffc61e5ce2;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                      (pCVar11,(Scalar *)&local_e7c8);
  local_e7e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x3f92db61bb05faec;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                      (pCVar11,(Scalar *)&local_e7e0);
  local_e780._0_8_ = (RhsNested)0xbfdab4b28f33e50a;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                      (pCVar11,(Scalar *)local_e780);
  local_e798._0_8_ = (RhsNested)0xbfca11f926c7eae6;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                      (pCVar11,(Scalar *)local_e798);
  local_e738[0] = (void *)0xbfdc60b044000a11;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                      (pCVar11,(Scalar *)local_e738);
  local_e750[0] = (RhsNested)&DAT_bfd1111134dba9df;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                      (pCVar11,(Scalar *)local_e750);
  local_e870._0_8_ = &DAT_3fdae264e48626f6;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                      (pCVar11,(Scalar *)local_e870);
  local_e888._0_8_ = &DAT_3fe13d1782d38477;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                      (pCVar11,(Scalar *)local_e888);
  local_e870._24_8_ = &DAT_3fdf4168eb7be47d;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                      (pCVar11,(Scalar *)(local_e870 + 0x18));
  local_e800 = &DAT_bfe51d9ae5c9f3d4;
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
            (pCVar11,(Scalar *)&local_e800);
  if (((long)&(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_e3d8[0].m_row)->
              m_storage).m_data + local_e3d8[0].m_currentBlockRows != 4) ||
     (local_e3d8[0].m_col != 4)) {
    __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                  ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                  "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 4, 4>>::finished() [MatrixType = Eigen::Matrix<double, 4, 4>]"
                 );
  }
  stateObservation::LinearKalmanFilter::getBmatrixRandom();
  stateObservation::KalmanFilterBase::getCmatrixRandom();
  stateObservation::LinearKalmanFilter::getDmatrixRandom();
  memset(local_e3d8,0,0x3e90);
  memset(local_3eb8,0,16000);
  memset(&local_a548,0,0x3e90);
  stateObservation::ObserverBase::stateVectorZero();
  pMVar9 = local_e850;
  uVar8 = local_e870._24_8_;
  if ((RhsNested)local_e3d8[0].m_row != local_e850) {
    if ((long)local_e850 < 0) {
LAB_00108625:
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    free(local_e3d8[0].m_xpr);
    if (pMVar9 == (RhsNested)0x0) {
      pMVar12 = (Matrix<double,_4,_4,_0,_4,_4> *)0x0;
    }
    else {
      if ((ulong)pMVar9 >> 0x3d != 0) {
LAB_00107bc2:
        puVar13 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar13 = operator_delete;
        __cxa_throw(puVar13,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      pMVar12 = (Matrix<double,_4,_4,_0,_4,_4> *)malloc((long)pMVar9 * 8);
      if (pMVar9 != (RhsNested)0x1 && ((ulong)pMVar12 & 0xf) != 0) {
        __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                      "void *Eigen::internal::aligned_malloc(std::size_t)");
      }
      if (pMVar12 == (Matrix<double,_4,_4,_0,_4,_4> *)0x0) goto LAB_00107bc2;
    }
    local_e3d8[0].m_row = (Index)pMVar9;
    local_e3d8[0].m_xpr = pMVar12;
  }
  pMVar15 = (RhsNested)((long)pMVar9 - ((long)pMVar9 >> 0x3f) & 0xfffffffffffffffe);
  if (1 < (long)pMVar9) {
    lVar18 = 0;
    do {
      ppdVar1 = &(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)uVar8)->m_storage).
                 m_data + lVar18;
      dVar6 = (double)ppdVar1[1];
      pdVar5 = ((local_e3d8[0].m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>)
               .m_storage.m_data.array + lVar18;
      *pdVar5 = (double)*ppdVar1;
      pdVar5[1] = dVar6;
      lVar18 = lVar18 + 2;
    } while (lVar18 < (long)pMVar15);
  }
  if ((long)pMVar15 < (long)pMVar9) {
    do {
      ((local_e3d8[0].m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
      m_storage.m_data.array[(long)pMVar15] =
           (double)(&(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)uVar8)->m_storage
                     ).m_data)[(long)pMVar15];
      pMVar15 = (RhsNested)
                ((long)&(pMVar15->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                        m_storage.m_data + 1);
    } while (pMVar9 != pMVar15);
  }
  stateObservation::KalmanFilterBase::getRmatrixRandom();
  if (-1 < (long)((ulong)local_e848.m_lhs.m_lhs.m_rhs | (ulong)local_e848.m_lhs.m_lhs.m_lhs)) {
    local_66b8.x[0] = (double)local_e848.m_lhs.m_lhs.m_lhs;
    local_66b8.x[1] = (double)local_e848.m_lhs.m_lhs.m_rhs;
    local_66b8.x[2] = 0.01;
    local_66b8._0_8_ = &local_e848;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_e780,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                *)&local_66b8);
    free((void *)local_e848._0_8_);
    stateObservation::KalmanFilterBase::getQmatrixRandom();
    if (-1 < (long)((ulong)local_e848.m_lhs.m_lhs.m_rhs | (ulong)local_e848.m_lhs.m_lhs.m_lhs)) {
      local_66b8.x[0] = (double)local_e848.m_lhs.m_lhs.m_lhs;
      local_66b8.x[1] = (double)local_e848.m_lhs.m_lhs.m_rhs;
      local_66b8.x[2] = 0.01;
      local_66b8._0_8_ = &local_e848;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_e798,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                  *)&local_66b8);
      free((void *)local_e848._0_8_);
      local_66b8._0_8_ = local_e780;
      local_66b8.x[0] = (double)local_66b8._0_8_;
      Eigen::Matrix<double,-1,-1,0,-1,-1>::
      Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
                ((Matrix<double,_1,_1,0,_1,_1> *)local_e738,
                 (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
                  *)&local_66b8);
      local_66b8._0_8_ = local_e798;
      local_66b8.x[0] = (double)local_66b8._0_8_;
      Eigen::Matrix<double,-1,-1,0,-1,-1>::
      Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
                ((Matrix<double,_1,_1,0,_1,_1> *)local_e750,
                 (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
                  *)&local_66b8);
      stateObservation::ObserverBase::inputVectorRandom();
      pCVar10 = pCStack_a540;
      pCVar4 = local_a548;
      local_a548 = (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                    *)local_66b8._0_8_;
      pCStack_a540 = (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                      *)local_66b8.x[0];
      local_66b8._0_8_ = pCVar4;
      local_66b8.x[0] = (double)pCVar10;
      free(pCVar4);
      boost::random::lagged_fibonacci_01_engine<double,_48,_1279U,_418U>::seed
                (&local_66b8,
                 &boost::random::lagged_fibonacci_01_engine<double,48,1279u,418u>::default_seed);
      local_e890 = 1;
      do {
        stateObservation::ObserverBase::stateVectorZero();
        uVar19 = 0;
        while( true ) {
          lVar18 = stateObservation::ObserverBase::getStateSize();
          uVar14 = (ulong)uVar19;
          if (lVar18 <= (long)uVar14) break;
          dVar6 = boost::random::detail::unit_normal_distribution<double>::operator()
                            ((unit_normal_distribution<double> *)&local_e848,&local_66b8);
          if ((long)local_e870._8_8_ <= (long)uVar14) goto LAB_0010854a;
          *(double *)(local_e870._0_8_ + uVar14 * 8) = dVar6 + 0.0;
          uVar19 = uVar19 + 1;
        }
        if (local_e798._16_8_ != local_e870._8_8_) {
LAB_00108569:
          pcVar17 = 
          "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
          ;
LAB_0010857e:
          __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                        ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,pcVar17);
        }
        local_e848._0_8_ = local_e798;
        local_e848.m_lhs.m_lhs.m_lhs = (LhsNested)local_e870;
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>,Eigen::internal::assign_op<double,double>>
                  ((Matrix<double,__1,_1,_0,__1,_1> *)local_e848.m_lhs.m_lhs.m_lhs,
                   (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                    *)&local_e848,(assign_op<double,_double> *)local_e888,(type)0x0);
        stateObservation::ObserverBase::measureVectorZero();
        uVar19 = 0;
        while( true ) {
          lVar18 = stateObservation::ObserverBase::getMeasureSize();
          uVar14 = (ulong)uVar19;
          if (lVar18 <= (long)uVar14) break;
          dVar6 = boost::random::detail::unit_normal_distribution<double>::operator()
                            ((unit_normal_distribution<double> *)&local_e848,&local_66b8);
          if ((long)local_e888._8_8_ <= (long)uVar14) goto LAB_0010854a;
          (((PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_e888._0_8_)->m_storage).
          m_data.array[uVar14] = (double)(dVar6 + 0.0);
          uVar19 = uVar19 + 1;
        }
        if (local_e780._16_8_ != local_e888._8_8_) goto LAB_00108569;
        local_e848._0_8_ = local_e780;
        local_e848.m_lhs.m_lhs.m_lhs = (LhsNested)local_e888;
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>,Eigen::internal::assign_op<double,double>>
                  ((Matrix<double,__1,_1,_0,__1,_1> *)local_e848.m_lhs.m_lhs.m_lhs,
                   (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                    *)&local_e848,(assign_op<double,_double> *)&local_e800,(type)0x0);
        stateObservation::ObserverBase::inputVectorRandom();
        pMVar16 = *(LhsNested *)((long)&local_a558 + (local_e890 + 1) * 0x10);
        pCVar4 = *(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                   **)((long)&local_a558 + (local_e890 + 1) * 0x10 + 8);
        *(undefined8 *)((long)&local_a558 + (local_e890 + 1) * 0x10) = local_e848._0_8_;
        *(LhsNested *)((long)&local_a558 + (local_e890 + 1) * 0x10 + 8) =
             local_e848.m_lhs.m_lhs.m_lhs;
        local_e848._0_8_ = pMVar16;
        local_e848.m_lhs.m_lhs.m_lhs = (LhsNested)pCVar4;
        free(pMVar16);
        if (local_e850 != (RhsNested)0x4) {
          pcVar17 = 
          "Eigen::Product<Eigen::Matrix<double, 4, 4>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, 4, 4>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
          ;
          goto LAB_0010857e;
        }
        pMVar20 = (Matrix<double,__1,_1,_0,__1,_1> *)(local_e870 + 0x18);
        if ((LhsNested)local_e870._8_8_ != (LhsNested)0x4) {
          pcVar17 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Product<Eigen::Matrix<double, 4, 4>, Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Product<Eigen::Matrix<double, 4, 4>, Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::Matrix<double, -1, 1>]"
          ;
          goto LAB_001085e2;
        }
        pMVar16 = (LhsNested)((local_e890 + -1) * 0x10);
        if (local_e7a0 != *(LhsNested *)((long)&local_a558 + local_e890 * 0x10 + 8))
        goto LAB_00108569;
        local_e848.m_rhs.m_rhs = (RhsNested)((long)&local_a558 + local_e890 * 0x10);
        local_e848.m_lhs.m_lhs.m_lhs = &local_e458;
        local_e848.m_lhs.m_rhs = (RhsNested)local_e870;
        local_e848.m_rhs.m_lhs = (LhsNested)&local_e7b0;
        local_e848.m_lhs.m_lhs.m_rhs = pMVar20;
        local_e780._40_8_ = pMVar16;
        if (local_e7a8 != 4) {
          pcVar17 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Product<Eigen::Matrix<double, 4, 4>, Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Product<Eigen::Matrix<double, 4, 4>, Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>]"
          ;
          goto LAB_001085e2;
        }
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>,Eigen::internal::assign_op<double,double>>
                  (pMVar20,&local_e848,(assign_op<double,_double> *)&local_e800,(type)0x0);
        pMVar9 = local_e850;
        uVar8 = local_e870._24_8_;
        if ((RhsNested)(&local_e3d8[0].m_row)[local_e890 * 2] != local_e850) {
          if ((long)local_e850 < 0) goto LAB_00108625;
          Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
                    ((DenseStorage<double,__1,__1,_1,_0> *)(&local_e3d8[0].m_xpr + local_e890 * 2),
                     (Index)local_e850,(Index)local_e850,1);
          if ((RhsNested)(&local_e3d8[0].m_row)[local_e890 * 2] != pMVar9) {
            pcVar17 = 
            "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
            ;
            goto LAB_00108659;
          }
        }
        pdVar5 = ((DenseStorage<double,__1,__1,_1,_0> *)(&local_e3d8[0].m_xpr + local_e890 * 2))->
                 m_data;
        pMVar15 = (RhsNested)((long)pMVar9 - ((long)pMVar9 >> 0x3f) & 0xfffffffffffffffe);
        if (1 < (long)pMVar9) {
          lVar18 = 0;
          do {
            ppdVar1 = &(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)uVar8)->
                       m_storage).m_data + lVar18;
            dVar6 = (double)ppdVar1[1];
            pdVar2 = pdVar5 + lVar18;
            *pdVar2 = (double)*ppdVar1;
            pdVar2[1] = dVar6;
            lVar18 = lVar18 + 2;
          } while (lVar18 < (long)pMVar15);
        }
        if ((long)pMVar15 < (long)pMVar9) {
          do {
            pdVar5[(long)pMVar15] =
                 (double)(&(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)uVar8)->
                           m_storage).m_data)[(long)pMVar15];
            pMVar15 = (RhsNested)
                      ((long)&(pMVar15->
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                              m_storage.m_data + 1);
          } while (pMVar9 != pMVar15);
        }
        if (local_e7b8 != local_e850) goto LAB_00108569;
        if (local_e7c0 != (LhsNested)local_e888._8_8_) {
          pcVar17 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::Matrix<double, -1, 1>]"
          ;
          goto LAB_001085e2;
        }
        if (local_e7e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols != *(long *)((long)&local_a558 + (local_e890 + 1) * 0x10 + 8)) goto LAB_00108569;
        local_e848.m_lhs.m_lhs.m_lhs = (LhsNested)&local_e7c8;
        local_e848.m_lhs.m_lhs.m_rhs = (RhsNested)(local_e870 + 0x18);
        local_e848.m_lhs.m_rhs = (RhsNested)local_e888;
        local_e848.m_rhs.m_lhs = &local_e7e0;
        local_e848.m_rhs.m_rhs = (RhsNested)((long)&local_a558 + (local_e890 + 1) * 0x10);
        if (local_e7c0 !=
            (LhsNested)
            local_e7e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_rows) {
          pcVar17 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>]"
          ;
          goto LAB_001085e2;
        }
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>,Eigen::internal::assign_op<double,double>>
                  ((Matrix<double,__1,_1,_0,__1,_1> *)
                   ((long)&local_3eb8[0].
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                           m_data + local_e780._40_8_),
                   (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                    *)&local_e848,(assign_op<double,_double> *)&local_e800,(type)0x0);
        free((void *)local_e888._0_8_);
        free((void *)local_e870._0_8_);
        local_e890 = local_e890 + 1;
      } while (local_e890 != 0x3e9);
      stateObservation::ObserverBase::stateVectorRandom();
      stateObservation::ZeroDelayObserver::setState((Matrix *)local_e720,(long)&local_e800);
      stateObservation::KalmanFilterBase::getPmatrixZero();
      for (uVar14 = 0; lVar18 = stateObservation::ObserverBase::getStateSize(),
          (long)uVar14 < lVar18; uVar14 = (ulong)((int)uVar14 + 1)) {
        if ((long)local_e7f8 <= (long)uVar14) {
LAB_0010854a:
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x19a,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                       );
        }
        if (((long)local_e870._8_8_ <= (long)uVar14) || ((long)local_e870._16_8_ <= (long)uVar14)) {
          __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                       );
        }
        *(double *)(local_e870._0_8_ + (local_e870._8_8_ * uVar14 + uVar14) * 8) =
             *(double *)(local_e800 + uVar14 * 8);
      }
      local_e888._0_8_ = (LhsNested)local_e870;
      local_e888._8_8_ = (LhsNested)local_e870;
      Eigen::Matrix<double,-1,-1,0,-1,-1>::
      Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
                ((Matrix<double,_1,_1,0,_1,_1> *)&local_e848,
                 (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
                  *)local_e888);
      pMVar20 = local_3eb8;
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
                ((Matrix<double,__1,__1,_0,__1,__1> *)local_e870,
                 (Matrix<double,__1,__1,_0,__1,__1> *)&local_e848,
                 (assign_op<double,_double> *)&local_e7f0);
      free((void *)local_e848._0_8_);
      stateObservation::KalmanFilterBase::setStateCovariance((Matrix *)local_e720);
      local_e848._0_8_ = (LhsNested)0x0;
      local_e848.m_lhs.m_lhs.m_lhs = (LhsNested)0x0;
      local_e848.m_lhs.m_lhs.m_rhs = (Matrix<double,__1,_1,_0,__1,_1> *)0x0;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)&local_e848,0x10,4,4);
      if ((((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
             *)local_e848.m_lhs.m_lhs.m_lhs !=
            (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
             *)0x4) || (local_e848.m_lhs.m_lhs.m_rhs != (Matrix<double,__1,_1,_0,__1,_1> *)0x4)) &&
         ((Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                     ((DenseStorage<double,__1,__1,__1,_0> *)&local_e848,0x10,4,4),
          (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
           *)local_e848.m_lhs.m_lhs.m_lhs !=
          (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
           *)0x4 || (local_e848.m_lhs.m_lhs.m_rhs != (Matrix<double,__1,_1,_0,__1,_1> *)0x4)))) {
        pcVar17 = 
        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::Matrix<double, 4, 4>, T1 = double, T2 = double]"
        ;
LAB_00108659:
        __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,pcVar17);
      }
      uVar14 = 0xfffffffffffffffe;
      do {
        uVar8 = local_e458.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[uVar14 + 3];
        pIVar3 = &(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_e848._0_8_)
                  ->m_storage).m_cols + uVar14;
        *pIVar3 = (Index)local_e458.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                         m_storage.m_data.array[uVar14 + 2];
        pIVar3[1] = uVar8;
        uVar14 = uVar14 + 2;
      } while (uVar14 < 0xe);
      stateObservation::KalmanFilterBase::setA((Matrix *)local_e720);
      free((void *)local_e848._0_8_);
      stateObservation::LinearKalmanFilter::setB((Matrix *)local_e720);
      stateObservation::KalmanFilterBase::setC((Matrix *)local_e720);
      stateObservation::LinearKalmanFilter::setD((Matrix *)local_e720);
      stateObservation::KalmanFilterBase::setR((Matrix *)local_e720);
      stateObservation::KalmanFilterBase::setQ((Matrix *)local_e720);
      stateObservation::ZeroDelayObserver::setInput((Matrix *)local_e720,(long)&local_a548);
      lVar21 = 1;
      lVar18 = (long)local_a538;
      do {
        stateObservation::ZeroDelayObserver::setMeasurement((Matrix *)local_e720,(long)pMVar20);
        stateObservation::ZeroDelayObserver::setInput((Matrix *)local_e720,lVar18);
        lVar21 = lVar21 + 1;
        lVar18 = lVar18 + 0x10;
        pMVar20 = pMVar20 + 1;
      } while (lVar21 != 0x3e9);
      stateObservation::ZeroDelayObserver::getEstimatedState((long)local_e888);
      local_e848.m_lhs.m_lhs.m_lhs = (LhsNested)&local_a558;
      local_e848._0_8_ = (LhsNested)local_e888;
      if (local_e888._8_8_ ==
          local_a558.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
         ) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
        PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_e7f0,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    *)&local_e848);
        free((void *)local_e888._0_8_);
        local_e888._0_8_ = (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_e7f0;
        if (local_e7e8 == 0) {
          uVar22 = 0;
          uVar23 = 0;
        }
        else {
          if (local_e7e8 < 1) {
            __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                          "/usr/include/eigen3/Eigen/src/Core/Redux.h",0x19b,
                          "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, 1>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                         );
          }
          local_e848.m_lhs.m_lhs.m_lhs = (LhsNested)local_e7f0.data;
          SVar7 = Eigen::internal::
                  redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                  ::
                  run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                            ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              *)&local_e848,(scalar_sum_op<double,_double> *)(local_e888 + 0x17),
                             (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                              *)local_e888);
          uVar22 = SUB84(SVar7,0);
          uVar23 = (undefined4)((ulong)SVar7 >> 0x20);
        }
        free(local_e7f0.data);
        free((void *)local_e870._0_8_);
        free(local_e800);
        free(local_e750[0]);
        free(local_e738[0]);
        free((void *)local_e798._0_8_);
        free((void *)local_e780._0_8_);
        free((void *)local_e870._24_8_);
        lVar18 = 0x3e90;
        do {
          free(*(void **)((long)&local_a558 + lVar18));
          lVar18 = lVar18 + -0x10;
        } while (lVar18 != 0);
        lVar18 = 16000;
        do {
          free(*(void **)((long)&local_3eb8[-1].
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                 m_storage.m_data + lVar18));
          lVar18 = lVar18 + -0x10;
        } while (lVar18 != 0);
        lVar18 = 0x3e90;
        do {
          free(*(void **)((long)local_e458.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array + lVar18 + 0x70));
          lVar18 = lVar18 + -0x10;
        } while (lVar18 != 0);
        free(local_e7e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data);
        free(local_e7c8);
        free(local_e7b0);
        local_e720[0] = (RhsNested)local_e780._24_8_;
        local_e630 = local_e780._32_8_;
        free(pvStack_e470);
        free(local_e488);
        stateObservation::KalmanFilterBase::~KalmanFilterBase((KalmanFilterBase *)local_e720);
        return SQRT((double)CONCAT44(uVar23,uVar22));
      }
      pcVar17 = 
      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
      ;
LAB_001085e2:
      __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                    "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,pcVar17);
    }
  }
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

double testKalmanFilter()
{

  typedef stateObservation::LinearKalmanFilter filter;

  filter f(4, 3, 2);
  Eigen::Matrix<double, 4, 4> a;

  a << -0.6785714, 0.1156463, 0.4392517, 0.2863946, 0.0865306, -0.0273810, 0.3355102, 0.0184150, -0.4172789, -0.2036735,
      -0.4434014, -0.2666667, 0.4200680, 0.5387075, 0.4883673, -0.6598639;

  filter::Bmatrix b = f.getBmatrixRandom();
  filter::Cmatrix c = f.getCmatrixRandom();
  filter::Dmatrix d = f.getDmatrixRandom();

  const stateObservation::Index kmax = 1000;

  filter::StateVector xk[kmax + 1];
  filter::MeasureVector yk[kmax];
  filter::InputVector uk[kmax + 1];

  filter::StateVector x = f.stateVectorZero();

  xk[0] = x;

  filter::Rmatrix r1 = f.getRmatrixRandom() * 0.01;

  filter::Qmatrix q1 = f.getQmatrixRandom() * 0.01;

  filter::Rmatrix r(r1 * r1.transpose());
  filter::Qmatrix q(q1 * q1.transpose());

  uk[0] = f.inputVectorRandom();

  boost::lagged_fibonacci1279 gen_;
  for(stateObservation::Index k = 1; k <= kmax; ++k)
  {

    filter::StateVector v = f.stateVectorZero();
    for(unsigned i = 0; i < f.getStateSize(); ++i)
    {
      boost::normal_distribution<> g(0, 1);
      v[i] = g(gen_);
    }
    v = q1 * v;

    filter::MeasureVector w = f.measureVectorZero();
    for(unsigned i = 0; i < f.getMeasureSize(); ++i)
    {
      boost::normal_distribution<> g(0, 1);
      w[i] = g(gen_);
    }
    w = r1 * w;

    uk[k] = f.inputVectorRandom();

    xk[k] = x = a * x + v + b * uk[k - 1];
    yk[k - 1] = c * x + w + d * uk[k];
  }

  filter::StateVector xh = f.stateVectorRandom();

  f.setState(xh, 0);

  filter::Pmatrix p = f.getPmatrixZero();

  for(unsigned i = 0; i < f.getStateSize(); ++i)
  {
    p(i, i) = xh[i];
  }
  p = p * p.transpose();

  f.setStateCovariance(p);

  f.setA(a);
  f.setB(b);
  f.setC(c);
  f.setD(d);

  f.setR(r);
  f.setQ(q);

  f.setInput(uk[0], 0);

  stateObservation::Index i;
  for(i = 1; i <= kmax; ++i)
  {
    f.setMeasurement(yk[i - 1], i);
    f.setInput(uk[i], i);
  }

  filter::StateVector error = f.getEstimatedState(kmax) - xk[kmax];

  return error.norm();
}